

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int LoadStorageValue(uint position)

{
  uchar *data;
  int *dataPtr;
  uchar *fileData;
  char local_218 [4];
  uint dataSize;
  char path [512];
  int local_10;
  int value;
  uint position_local;
  
  local_10 = 0;
  memset(local_218,0,0x200);
  strcpy(local_218,"storage.data");
  fileData._4_4_ = 0;
  data = LoadFileData(local_218,(uint *)((long)&fileData + 4));
  if (data != (uchar *)0x0) {
    if (fileData._4_4_ < position << 2) {
      TraceLog(4,"SYSTEM: Failed to find storage position");
    }
    else {
      local_10 = *(int *)(data + (ulong)position * 4);
    }
    UnloadFileData(data);
  }
  return local_10;
}

Assistant:

int LoadStorageValue(unsigned int position)
{
    int value = 0;

#if defined(SUPPORT_DATA_STORAGE)
    char path[512] = { 0 };
#if defined(PLATFORM_ANDROID)
    strcpy(path, CORE.Android.internalDataPath);
    strcat(path, "/");
    strcat(path, STORAGE_DATA_FILE);
#elif defined(PLATFORM_UWP)
    strcpy(path, CORE.UWP.internalDataPath);
    strcat(path, "/");
    strcat(path, STORAGE_DATA_FILE);
#else
    strcpy(path, STORAGE_DATA_FILE);
#endif

    unsigned int dataSize = 0;
    unsigned char *fileData = LoadFileData(path, &dataSize);

    if (fileData != NULL)
    {
        if (dataSize < (position*4)) TRACELOG(LOG_WARNING, "SYSTEM: Failed to find storage position");
        else
        {
            int *dataPtr = (int *)fileData;
            value = dataPtr[position];
        }

        UnloadFileData(fileData);
    }
#endif
    return value;
}